

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_dls.cpp
# Opt level: O2

Instrument * Timidity::load_instrument_dls(Renderer *song,int drum,int bank,int instrument)

{
  int *piVar1;
  undefined8 uVar2;
  uint uVar3;
  DLS_Data *pDVar4;
  DLS_Instrument *pDVar5;
  long lVar6;
  DLS_Wave *pDVar7;
  uint *puVar8;
  long lVar9;
  WaveFMT *pWVar10;
  long lVar11;
  ushort uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  Instrument *pIVar19;
  Sample *pSVar20;
  long lVar21;
  long lVar22;
  CONNECTION *artList;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  ULONG cConnections;
  double dVar29;
  double dVar30;
  undefined1 auVar31 [16];
  
  pDVar4 = song->patches;
  if (pDVar4 != (DLS_Data *)0x0) {
    uVar26 = (uint)(drum != 0) * -0x80000000;
    uVar23 = pDVar4->cInstruments;
    uVar28 = (ulong)uVar23;
    lVar27 = 0;
    lVar21 = 0;
    for (uVar24 = 0; uVar25 = uVar28, uVar28 != uVar24; uVar24 = uVar24 + 1) {
      pDVar5 = pDVar4->instruments;
      lVar21 = *(long *)((long)&pDVar5->header + lVar27);
      uVar3 = *(uint *)(lVar21 + 4);
      if ((((uVar3 & 0x80000000) == uVar26) && ((uVar3 >> 8 & 0xff) == bank)) &&
         (*(int *)(lVar21 + 8) == instrument)) {
        lVar21 = (long)&pDVar5->name + lVar27;
        uVar25 = uVar24;
        break;
      }
      lVar21 = (long)&pDVar5->name + lVar27;
      lVar27 = lVar27 + 0x28;
    }
    if ((bank == 0) && ((uint)uVar25 == uVar23)) {
      lVar21 = 0;
      uVar25 = 0;
      while( true ) {
        if (uVar28 == uVar25) {
          return (Instrument *)0x0;
        }
        lVar27 = *(long *)((long)&pDVar4->instruments->header + lVar21);
        if (((*(uint *)(lVar27 + 4) & 0x80000000) == uVar26) && (*(int *)(lVar27 + 8) == instrument)
           ) break;
        uVar25 = uVar25 + 1;
        lVar21 = lVar21 + 0x28;
      }
      lVar21 = (long)&pDVar4->instruments->name + lVar21;
    }
    if ((uint)uVar25 != uVar23) {
      pIVar19 = (Instrument *)safe_malloc(0x10);
      iVar13 = **(int **)(lVar21 + 8);
      pIVar19->samples = iVar13;
      pSVar20 = (Sample *)safe_malloc((long)iVar13 * 0x68);
      pIVar19->sample = pSVar20;
      lVar22 = 0;
      memset(pSVar20,0,(long)pIVar19->samples * 0x68);
      lVar27 = 0x28;
      for (uVar24 = 0; uVar24 < **(uint **)(lVar21 + 8); uVar24 = uVar24 + 1) {
        pSVar20 = pIVar19->sample;
        lVar6 = *(long *)(lVar21 + 0x10);
        pDVar7 = song->patches->waveList;
        uVar23 = *(uint *)(*(long *)(lVar6 + -0x20 + lVar27) + 8);
        (&pSVar20->type)[lVar22] = '\x01';
        puVar8 = *(uint **)(lVar6 + -0x28 + lVar27);
        (&pSVar20->self_nonexclusive)[lVar22] = (bool)((byte)puVar8[2] & 1);
        *(short *)((long)&pSVar20->key_group + lVar22) = (short)*(char *)((long)puVar8 + 10);
        uVar26 = *puVar8;
        auVar31._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
        auVar31._4_2_ = (short)(uVar26 >> 0x10);
        auVar31._0_4_ = uVar26;
        dVar29 = exp2((double)(uVar26 & 0xffff) * 0.08333333333333333);
        dVar30 = exp2((double)auVar31._4_4_ * 0.08333333333333333);
        *(ulong *)((long)&pSVar20->low_freq + lVar22) =
             CONCAT44((float)(dVar30 * 8175.798947309669),(float)(dVar29 * 8175.798947309669));
        lVar9 = *(long *)(lVar6 + -0x18 + lVar27);
        dVar29 = exp2((double)((float)(int)*(short *)(lVar9 + 6) * 0.01 +
                              (float)*(ushort *)(lVar9 + 4)) * 0.08333333333333333);
        *(float *)((long)&pSVar20->root_freq + lVar22) = (float)(dVar29 * 8175.798947309669);
        (&pSVar20->low_vel)[lVar22] = (BYTE)puVar8[1];
        (&pSVar20->high_vel)[lVar22] = *(BYTE *)((long)puVar8 + 6);
        pWVar10 = pDVar7[uVar23].format;
        *(ushort *)((long)&pSVar20->modes + lVar22) = (pWVar10->wBitsPerSample == 8) + 1;
        *(DWORD *)((long)&pSVar20->sample_rate + lVar22) = pWVar10->dwSamplesPerSec;
        *(undefined8 *)((long)&pSVar20->data + lVar22) = 0;
        *(DWORD *)((long)&pSVar20->data_length + lVar22) = pDVar7[uVar23].length;
        convert_sample_data((Sample *)((long)&pSVar20->loop_start + lVar22),pDVar7[uVar23].data);
        lVar9 = *(long *)(lVar6 + -0x18 + lVar27);
        uVar12 = *(ushort *)((long)&pSVar20->modes + lVar22);
        if (*(int *)(lVar9 + 0x10) != 0) {
          uVar12 = uVar12 | 0x24;
          *(ushort *)((long)&pSVar20->modes + lVar22) = uVar12;
          lVar11 = *(long *)(lVar6 + -0x10 + lVar27);
          uVar23 = *(uint *)(lVar11 + 8) >> 1;
          *(uint *)((long)&pSVar20->loop_start + lVar22) = uVar23;
          *(uint *)((long)&pSVar20->loop_end + lVar22) = (*(uint *)(lVar11 + 0xc) >> 1) + uVar23;
        }
        *(undefined2 *)((long)&pSVar20->scale_factor + lVar22) = 0x400;
        *(undefined2 *)((long)&pSVar20->scale_note + lVar22) = *(undefined2 *)(lVar9 + 4);
        if ((uVar12 & 0x20) != 0) {
          if (((*(long *)(lVar21 + 0x18) == 0) ||
              (cConnections = *(ULONG *)(*(long *)(lVar21 + 0x18) + 4), cConnections == 0)) ||
             (artList = *(CONNECTION **)(lVar21 + 0x20), artList == (CONNECTION *)0x0)) {
            artList = *(CONNECTION **)(lVar6 + lVar27);
            cConnections = *(ULONG *)(*(long *)(lVar6 + -8 + lVar27) + 4);
          }
          iVar13 = load_connection(cConnections,artList,0x206);
          iVar14 = load_connection(cConnections,artList,0x20c);
          iVar15 = load_connection(cConnections,artList,0x207);
          iVar16 = load_connection(cConnections,artList,0x209);
          iVar17 = load_connection(cConnections,artList,0x20a);
          iVar18 = load_connection(cConnections,artList,4);
          *(short *)((long)&pSVar20->panning + lVar22) =
               (short)(int)((double)(iVar18 / 0x10000) * 16.383 + 8191.5);
          *(undefined2 *)((long)&pSVar20->envelope + lVar22) = 0x8000;
          *(short *)((long)&pSVar20->envelope + lVar22 + 2) = (short)((uint)iVar13 >> 0x10);
          *(short *)((long)&pSVar20->envelope + lVar22 + 4) = (short)((uint)iVar14 >> 0x10);
          *(short *)((long)&pSVar20->envelope + lVar22 + 6) = (short)((uint)iVar15 >> 0x10);
          *(short *)((long)&pSVar20->envelope + lVar22 + 10) = (short)((uint)iVar16 >> 0x10);
          *(short *)((long)&pSVar20->envelope + lVar22 + 8) = (short)((uint)iVar17 >> 0x10);
        }
        piVar1 = (int *)((long)&pSVar20->data_length + lVar22);
        *piVar1 = *piVar1 << 0xc;
        uVar2 = *(undefined8 *)((long)&pSVar20->loop_start + lVar22);
        *(ulong *)((long)&pSVar20->loop_start + lVar22) =
             CONCAT44((int)((ulong)uVar2 >> 0x20) << 0xc,(int)uVar2 << 0xc);
        lVar22 = lVar22 + 0x68;
        lVar27 = lVar27 + 0x30;
      }
      return pIVar19;
    }
  }
  return (Instrument *)0x0;
}

Assistant:

Instrument *load_instrument_dls(Renderer *song, int drum, int bank, int instrument)
{
	Instrument *inst;
	DWORD i;
	DLS_Instrument *dls_ins = NULL;

	if (song->patches == NULL)
	{
		return NULL;
	}
	drum = drum ? 0x80000000 : 0;
	for (i = 0; i < song->patches->cInstruments; ++i)
	{
		dls_ins = &song->patches->instruments[i];
		if ((dls_ins->header->Locale.ulBank & 0x80000000) == (ULONG)drum &&
			((dls_ins->header->Locale.ulBank >> 8) & 0xFF) == (ULONG)bank &&
			dls_ins->header->Locale.ulInstrument == (ULONG)instrument)
			break;
	}
	if (i == song->patches->cInstruments && bank == 0)
	{
		for (i = 0; i < song->patches->cInstruments; ++i)
		{
			dls_ins = &song->patches->instruments[i];
			if ((dls_ins->header->Locale.ulBank & 0x80000000) == (ULONG)drum &&
				dls_ins->header->Locale.ulInstrument == (ULONG)instrument)
				break;
		}
	}
	if (i == song->patches->cInstruments)
	{
//		SNDDBG(("Couldn't find %s instrument %d in bank %d\n", drum ? "drum" : "melodic", instrument, bank));
		return NULL;
	}

	inst = (Instrument *)safe_malloc(sizeof(Instrument));
	inst->samples = dls_ins->header->cRegions;
	inst->sample = (Sample *)safe_malloc(inst->samples * sizeof(Sample));
	memset(inst->sample, 0, inst->samples * sizeof(Sample));
	/*
	printf("Found %s instrument %d in bank %d named %s with %d regions\n", drum ? "drum" : "melodic", instrument, bank, dls_ins->name, inst->samples);
	*/
	for (i = 0; i < dls_ins->header->cRegions; ++i)
	{
		load_region_dls(song, &inst->sample[i], dls_ins, i);
	}
	return inst;
}